

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_class.hpp
# Opt level: O0

void __thiscall
libtorrent::peer_class_info::peer_class_info(peer_class_info *this,peer_class_info *param_1)

{
  undefined3 uVar1;
  int iVar2;
  peer_class_info *param_1_local;
  peer_class_info *this_local;
  
  uVar1 = *(undefined3 *)&param_1->field_0x1;
  iVar2 = param_1->connection_limit_factor;
  this->ignore_unchoke_slots = param_1->ignore_unchoke_slots;
  *(undefined3 *)&this->field_0x1 = uVar1;
  this->connection_limit_factor = iVar2;
  ::std::__cxx11::string::string((string *)&this->label,(string *)&param_1->label);
  iVar2 = param_1->download_limit;
  this->upload_limit = param_1->upload_limit;
  this->download_limit = iVar2;
  iVar2 = param_1->download_priority;
  this->upload_priority = param_1->upload_priority;
  this->download_priority = iVar2;
  return;
}

Assistant:

struct TORRENT_EXPORT peer_class_info
	{
		// ``ignore_unchoke_slots`` determines whether peers should always
		// unchoke a peer, regardless of the choking algorithm, or if it should
		// honor the unchoke slot limits. It's used for local peers by default.
		// If *any* of the peer classes a peer belongs to has this set to true,
		// that peer will be unchoked at all times.
		bool ignore_unchoke_slots;

		// adjusts the connection limit (global and per torrent) that applies to
		// this peer class. By default, local peers are allowed to exceed the
		// normal connection limit for instance. This is specified as a percent
		// factor. 100 makes the peer class apply normally to the limit. 200
		// means as long as there are fewer connections than twice the limit, we
		// accept this peer. This factor applies both to the global connection
		// limit and the per-torrent limit. Note that if not used carefully one
		// peer class can potentially completely starve out all other over time.
		int connection_limit_factor;

		// not used by libtorrent. It's intended as a potentially user-facing
		// identifier of this peer class.
		std::string label;

		// transfer rates limits for the whole peer class. They are specified in
		// bytes per second and apply to the sum of all peers that are members of
		// this class.
		int upload_limit;
		int download_limit;

		// relative priorities used by the bandwidth allocator in the rate
		// limiter. If no rate limits are in use, the priority is not used
		// either. Priorities start at 1 (0 is not a valid priority) and may not
		// exceed 255.
		int upload_priority;
		int download_priority;
	}